

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

double __thiscall libDAI::TRW::calc_rho_descent(TRW *this)

{
  mapped_type mVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer pVVar7;
  undefined4 extraout_var_00;
  pointer pVVar8;
  undefined4 extraout_var_01;
  long *plVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined8 uVar12;
  undefined4 extraout_var_08;
  Var *n;
  pointer pVVar13;
  pointer pVVar14;
  undefined1 auVar15 [16];
  Real RVar16;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  DEdgeVec MST;
  Var v_j;
  Var v_i;
  WeightedGraph<double> wg;
  double local_110;
  double local_108;
  VarSet local_e8;
  TFactor<double> local_c8;
  Var local_88;
  Var local_78;
  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = 0.0;
  pVVar7 = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pVVar14 = pVVar7;
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    pVVar7 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x28))
                                ((long *)CONCAT44(extraout_var,iVar5));
    if (pVVar7 <= pVVar14) break;
    pVVar7 = (pointer)((long)&pVVar14->_label + 1);
    pVVar13 = pVVar7;
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar8 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x28))
                                  ((long *)CONCAT44(extraout_var_00,iVar5));
      if (pVVar8 <= pVVar13) break;
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x30))
                                 ((long *)CONCAT44(extraout_var_01,iVar5),pVVar14);
      local_78._label = *plVar9;
      local_78._states = plVar9[1];
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x30))
                                 ((long *)CONCAT44(extraout_var_02,iVar5),pVVar13);
      local_88._label = *plVar9;
      local_88._states = plVar9[1];
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x70))
                (&local_c8,(long *)CONCAT44(extraout_var_03,iVar5),&local_78);
      bVar4 = VarSet::operator&&(&local_c8._vs,&local_88);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_c8);
      if (bVar4) {
        VarSet::VarSet(&local_e8,&local_78,&local_88);
        (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xb])
                  (&local_c8,this,&local_e8);
        RVar16 = MutualInfo<double>(&local_c8);
        TFactor<double>::~TFactor(&local_c8);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_e8);
        local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar14;
        local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar13;
        pmVar10 = std::
                  map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  ::operator[]((map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                                *)&local_60,(key_type *)&local_c8);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_110;
        auVar3._8_8_ = extraout_XMM0_Qb;
        auVar3._0_8_ = RVar16;
        auVar17 = vmaxsd_avx(auVar3,auVar17);
        auVar15._8_8_ = 0x8000000000000000;
        auVar15._0_8_ = 0x8000000000000000;
        auVar15 = vxorpd_avx512vl(auVar3,auVar15);
        local_110 = auVar17._0_8_;
        mVar1 = (mapped_type)vmovlpd_avx(auVar15);
        *pmVar10 = mVar1;
      }
      pVVar13 = (pointer)((long)&pVVar13->_label + 1);
    }
  }
  for (p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    p_Var11[1]._M_left = (_Base_ptr)(local_110 + (double)p_Var11[1]._M_left);
  }
  MinSpanningTreePrims<double>((DEdgeVec *)&local_e8,(WeightedGraph<double> *)&local_60);
  pVVar7 = (pointer)0x0;
  while( true ) {
    pVVar14 = pVVar7;
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    pVVar7 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x28))
                                ((long *)CONCAT44(extraout_var_04,iVar5));
    if (pVVar7 <= pVVar14) break;
    pVVar7 = (pointer)((long)&pVVar14->_label + 1);
    pVVar13 = pVVar7;
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar8 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x28))
                                  ((long *)CONCAT44(extraout_var_05,iVar5));
      if (pVVar8 <= pVVar13) break;
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      iVar6 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x30))
                         ((long *)CONCAT44(extraout_var_07,iVar6),pVVar14);
      (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x70))
                (&local_c8,(long *)CONCAT44(extraout_var_06,iVar5),uVar12);
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x30))
                           ((long *)CONCAT44(extraout_var_08,iVar5),pVVar13);
      bVar4 = VarSet::operator&&(&local_c8._vs,n);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_c8);
      if (bVar4) {
        local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar14;
        local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar13;
        pmVar10 = std::
                  map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  ::operator[](&(this->_rho_e_descent).
                                super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                               ,(key_type *)&local_c8);
        *pmVar10 = 0.0;
      }
      pVVar13 = (pointer)((long)&pVVar13->_label + 1);
    }
  }
  local_108 = 0.0;
  for (pVVar7 = local_e8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                .super__Vector_impl_data._M_start;
      pVVar7 != local_e8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                .super__Vector_impl_data._M_finish; pVVar7 = pVVar7 + 1) {
    local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pVVar7->_label;
    local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pVVar7->_states;
    pmVar10 = std::
              map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
              ::operator[]((map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                            *)&local_60,(key_type *)&local_c8);
    dVar2 = *pmVar10;
    local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pVVar7->_label;
    local_c8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pVVar7->_states;
    pmVar10 = std::
              map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
              ::operator[](&(this->_rho_e_descent).
                            super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                           ,(key_type *)&local_c8);
    *pmVar10 = 1.0;
    local_108 = local_108 - (dVar2 - local_110);
  }
  std::_Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::~_Vector_base
            ((_Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)&local_e8);
  std::
  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ::~_Rb_tree(&local_60);
  return local_108;
}

Assistant:

double TRW::calc_rho_descent() {
        WeightedGraph<double> wg;
        // construct weighted graph with as weights the mutual information
        // according to the beliefs and take the maximum spanning tree to
        // find the descent direction
        double maxWeight = 0.0;
        for( size_t i = 0; i < grm().nrVars(); i++ )
            for( size_t j = i+1; j < grm().nrVars(); j++ ) {
                Var v_i = grm().var(i);
                Var v_j = grm().var(j);
                if( grm().delta(v_i) && v_j ) {
                    double w = MutualInfo( belief( v_i | v_j ) );
                    if( w > maxWeight )
                        maxWeight = w;
                    wg[UEdge(i,j)] = -w;
                }
            }
        // Add constant because BGL cannot handle negative weights
        for( WeightedGraph<double>::iterator e = wg.begin(); e != wg.end(); e++ )
            e->second += maxWeight;
            
        DEdgeVec MST = MinSpanningTreePrims( wg );

        for( size_t i = 0; i < grm().nrVars(); i++ )
            for( size_t j = i+1; j < grm().nrVars(); j++ )
                if( grm().delta(grm().var(i)) && grm().var(j) )
                    _rho_e_descent[UEdge(i,j)] = 0.0;
        double MinSpanningTreeWeight = 0.0;
        for( DEdgeVec::const_iterator e = MST.begin(); e != MST.end(); e++ ) {
            MinSpanningTreeWeight -= (wg[UEdge(*e)] - maxWeight);
            _rho_e_descent[UEdge(*e)] = 1.0;
        }

        assert( MinSpanningTreeWeight > 0.0 );
        return MinSpanningTreeWeight;
    }